

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

void tt_delta_interpolate
               (int p1,int p2,int ref1,int ref2,FT_Vector *in_points,FT_Vector *out_points)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  FT_Int32 FVar7;
  FT_Long FVar8;
  FT_Int32 local_78;
  FT_Fixed scale;
  FT_Pos d2;
  FT_Pos d1;
  FT_Pos out2;
  FT_Pos out1;
  FT_Pos in2;
  FT_Pos in1;
  FT_Pos out;
  int i;
  int p;
  FT_Vector *out_points_local;
  FT_Vector *in_points_local;
  int ref2_local;
  int ref1_local;
  int p2_local;
  int p1_local;
  
  if (p1 <= p2) {
    _i = out_points;
    out_points_local = in_points;
    in_points_local._0_4_ = ref2;
    in_points_local._4_4_ = ref1;
    for (out._0_4_ = 0; iVar6 = in_points_local._4_4_, (int)out < 2; out._0_4_ = (int)out + 1) {
      out_points_local = (FT_Vector *)(&out_points_local->x + (int)out);
      _i = (FT_Vector *)(&_i->x + (int)out);
      if (out_points_local[(int)in_points_local].x < out_points_local[in_points_local._4_4_].x) {
        in_points_local._4_4_ = (int)in_points_local;
        in_points_local._0_4_ = iVar6;
      }
      lVar1 = out_points_local[in_points_local._4_4_].x;
      lVar2 = out_points_local[(int)in_points_local].x;
      lVar3 = _i[in_points_local._4_4_].x;
      lVar4 = _i[(int)in_points_local].x;
      if ((lVar1 != lVar2) || (lVar3 == lVar4)) {
        out._4_4_ = p1;
        if (lVar1 == lVar2) {
          local_78 = 0;
        }
        else {
          FVar8 = FT_DivFix(lVar4 - lVar3,lVar2 - lVar1);
          local_78 = (FT_Int32)FVar8;
        }
        for (; out._4_4_ <= p2; out._4_4_ = out._4_4_ + 1) {
          lVar5 = out_points_local[out._4_4_].x;
          if (lVar1 < lVar5) {
            if (lVar5 < lVar2) {
              FVar7 = FT_MulFix_x86_64((int)lVar5 - (int)lVar1,local_78);
              in1 = lVar3 + FVar7;
            }
            else {
              in1 = (lVar4 - lVar2) + lVar5;
            }
          }
          else {
            in1 = (lVar3 - lVar1) + lVar5;
          }
          _i[out._4_4_].x = in1;
        }
      }
    }
  }
  return;
}

Assistant:

static void
  tt_delta_interpolate( int         p1,
                        int         p2,
                        int         ref1,
                        int         ref2,
                        FT_Vector*  in_points,
                        FT_Vector*  out_points )
  {
    int  p, i;

    FT_Pos  out, in1, in2, out1, out2, d1, d2;


    if ( p1 > p2 )
      return;

    /* handle both horizontal and vertical coordinates */
    for ( i = 0; i <= 1; i++ )
    {
      /* shift array pointers so that we can access `foo.y' as `foo.x' */
      in_points  = (FT_Vector*)( (FT_Pos*)in_points + i );
      out_points = (FT_Vector*)( (FT_Pos*)out_points + i );

      if ( in_points[ref1].x > in_points[ref2].x )
      {
        p    = ref1;
        ref1 = ref2;
        ref2 = p;
      }

      in1  = in_points[ref1].x;
      in2  = in_points[ref2].x;
      out1 = out_points[ref1].x;
      out2 = out_points[ref2].x;
      d1   = out1 - in1;
      d2   = out2 - in2;

      /* If the reference points have the same coordinate but different */
      /* delta, inferred delta is zero.  Otherwise interpolate.         */
      if ( in1 != in2 || out1 == out2 )
      {
        FT_Fixed  scale = in1 != in2 ? FT_DivFix( out2 - out1, in2 - in1 )
                                     : 0;


        for ( p = p1; p <= p2; p++ )
        {
          out = in_points[p].x;

          if ( out <= in1 )
            out += d1;
          else if ( out >= in2 )
            out += d2;
          else
            out = out1 + FT_MulFix( out - in1, scale );

          out_points[p].x = out;
        }
      }
    }
  }